

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O0

void __thiscall ON_PolynomialCurve::Destroy(ON_PolynomialCurve *this)

{
  ON_PolynomialCurve *this_local;
  
  this->m_dim = 0;
  this->m_is_rat = 0;
  this->m_order = 0;
  ON_SimpleArray<ON_4dPoint>::Destroy(&(this->m_cv).super_ON_SimpleArray<ON_4dPoint>);
  (this->m_domain).m_t[0] = 0.0;
  (this->m_domain).m_t[1] = 1.0;
  return;
}

Assistant:

void ON_PolynomialCurve::Destroy()
{
  m_dim = 0;
  m_is_rat = 0;
  m_order = 0;
  m_cv.Destroy();
  m_domain.m_t[0] = 0.0;
  m_domain.m_t[1] = 1.0;
}